

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyorigin.h
# Opt level: O3

void KeyOriginInfo::SerializationOps<DataStream,KeyOriginInfo_const,ActionSerialize>
               (long obj,DataStream *s)

{
  long in_FS_OFFSET;
  VectorFormatter<DefaultFormatter> local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s,
             (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,obj,obj + 4);
  VectorFormatter<DefaultFormatter>::
  Ser<DataStream,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            (&local_19,s,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(obj + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(KeyOriginInfo, obj) { READWRITE(obj.fingerprint, obj.path); }